

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2coords.h
# Opt level: O0

void S2::ValidFaceXYZtoUV(int face,S2Point *p,double *pu,double *pv)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  S2LogMessage local_58;
  S2LogMessageVoidify local_41;
  S2Point local_40;
  double *local_28;
  double *pv_local;
  double *pu_local;
  S2Point *p_local;
  int face_local;
  
  local_28 = pv;
  pv_local = pu;
  pu_local = p->c_;
  p_local._4_4_ = face;
  GetNorm(&local_40,face);
  dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)p,&local_40);
  if (dVar2 <= 0.0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2coords.h"
               ,0x16d,kFatal,(ostream *)&std::cerr);
    poVar1 = S2LogMessage::stream(&local_58);
    poVar1 = std::operator<<(poVar1,"Check failed: (p.DotProd(GetNorm(face))) > (0) ");
    S2LogMessageVoidify::operator&(&local_41,poVar1);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
  }
  switch(p_local._4_4_) {
  case 0:
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,1);
    dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,0);
    *pv_local = dVar2 / dVar3;
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,2);
    dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,0);
    *local_28 = dVar2 / dVar3;
    break;
  case 1:
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,0);
    dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,1);
    *pv_local = -dVar2 / dVar3;
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,2);
    dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,1);
    *local_28 = dVar2 / dVar3;
    break;
  case 2:
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,0);
    dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,2);
    *pv_local = -dVar2 / dVar3;
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,1);
    dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,2);
    *local_28 = -dVar2 / dVar3;
    break;
  case 3:
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,2);
    dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,0);
    *pv_local = dVar2 / dVar3;
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,1);
    dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,0);
    *local_28 = dVar2 / dVar3;
    break;
  case 4:
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,2);
    dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,1);
    *pv_local = dVar2 / dVar3;
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,0);
    dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,1);
    *local_28 = -dVar2 / dVar3;
    break;
  default:
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,1);
    dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,2);
    *pv_local = -dVar2 / dVar3;
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,0);
    dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)pu_local,2);
    *local_28 = -dVar2 / dVar3;
  }
  return;
}

Assistant:

inline void ValidFaceXYZtoUV(int face, const S2Point& p,
                             double* pu, double* pv) {
  S2_DCHECK_GT(p.DotProd(GetNorm(face)), 0);
  switch (face) {
    case 0:  *pu =  p[1] / p[0]; *pv =  p[2] / p[0]; break;
    case 1:  *pu = -p[0] / p[1]; *pv =  p[2] / p[1]; break;
    case 2:  *pu = -p[0] / p[2]; *pv = -p[1] / p[2]; break;
    case 3:  *pu =  p[2] / p[0]; *pv =  p[1] / p[0]; break;
    case 4:  *pu =  p[2] / p[1]; *pv = -p[0] / p[1]; break;
    default: *pu = -p[1] / p[2]; *pv = -p[0] / p[2]; break;
  }
}